

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_int>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
::destructor_impl(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_int>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                  *this)

{
  void *p;
  size_t sVar1;
  
  sVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar1 == 1) {
    AssertNotDebugCapacity(this);
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
        < 2) {
      return;
    }
    soo_slot(this);
    sVar1 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    (this->settings_).
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0xffffffffffffff9c;
    CommonFields::set_capacity((CommonFields *)this,sVar1);
    return;
  }
  if (sVar1 != 0) {
    slot_array(this);
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ != 0) {
      infoz(this);
      p = CommonFields::backing_array_start((CommonFields *)this);
      sVar1 = CommonFields::alloc_size((CommonFields *)this,0x10,8);
      Deallocate<8ul,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,int>>>
                ((allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_> *)this,p
                 ,sVar1);
      return;
    }
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, int>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, int>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, int>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, int>>]"
               );
}

Assistant:

inline void destructor_impl() {
    if (SwisstableGenerationsEnabled() &&
        capacity() >= InvalidCapacity::kMovedFrom) {
      return;
    }
    if (capacity() == 0) return;
    if (is_soo()) {
      if (!empty()) {
        ABSL_SWISSTABLE_IGNORE_UNINITIALIZED(destroy(soo_slot()));
      }
      return;
    }
    destroy_slots();
    dealloc();
  }